

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

OperatingState __thiscall helics::CommonCore::minFederateState(CommonCore *this)

{
  OperatingState OVar1;
  uint uVar2;
  const_iterator __begin1;
  const_iterator __end1;
  const_iterator local_48;
  const_iterator local_30;
  
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::begin
            (&local_48,&(this->loopFederates).dataStorage);
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
            (&local_30,&(this->loopFederates).dataStorage);
  uVar2 = 10;
  while ((OVar1 = (OperatingState)uVar2, local_48.offset != local_30.offset ||
         (local_48.vec != local_30.vec))) {
    uVar2 = uVar2 & 0xff;
    if ((OperatingState)*(uint *)&(local_48.ptr)->state < OVar1) {
      uVar2 = *(uint *)&(local_48.ptr)->state;
    }
    gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
    operator++(&local_48);
  }
  return OVar1;
}

Assistant:

OperatingState CommonCore::minFederateState() const
{
    OperatingState state{OperatingState::DISCONNECTED};
    for (const auto& fed : loopFederates) {
        if (fed.state < state) {
            state = fed.state;
        }
    }
    return state;
}